

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# henson-chai.cpp
# Opt level: O3

void catch_sig(int signum)

{
  char **args;
  char cVar1;
  pointer pLVar2;
  pointer pcVar3;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  element_type *this;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  void *__ptr;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int in_EDI;
  char **args_1;
  ulong uVar13;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  int rank;
  char *begin_offset;
  char *begin_name;
  char *funcname;
  int status;
  size_t funcnamesize;
  void *callstack [128];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  char *local_468;
  int local_45c;
  char *local_458;
  char *local_450;
  int local_444;
  int local_440 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  this = logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pLVar2 = ((proc_map.super___shared_ptr<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           levels_).
           super__Vector_base<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = pLVar2[-1].group._M_dataplus._M_p;
  local_45c = in_EDI;
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_438,pcVar3,pcVar3 + pLVar2[-1].group._M_string_length);
  MPI_Comm_rank(((proc_map.super___shared_ptr<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                levels_).
                super__Vector_base<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].local,&local_488);
  local_440[0] = (undefined4)local_488;
  local_488 = 0;
  uStack_480 = 0;
  local_478 = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x45;
  fmt.data_ = "caught signal {}; active puppet {}; local group = {}, local rank = {}";
  spdlog::logger::log_<int&,std::__cxx11::string&,std::__cxx11::string,int>
            (this,loc,critical,fmt,&local_45c,&active_puppet_abi_cxx11_,local_438,local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  uVar6 = backtrace(local_438,0x80);
  __ptr = (void *)backtrace_symbols(local_438);
  local_440[0] = 0x100;
  local_440[1] = 0;
  local_450 = (char *)malloc(0x100);
  if (1 < (int)uVar6) {
    uVar13 = 1;
    do {
      local_458 = (char *)0x0;
      local_468 = (char *)0x0;
      args = (char **)((long)__ptr + uVar13 * 8);
      pcVar7 = *(char **)((long)__ptr + uVar13 * 8);
      pcVar12 = (char *)0x0;
      pcVar10 = (char *)0x0;
LAB_00149627:
      cVar1 = *pcVar7;
      pcVar8 = pcVar7;
      pcVar11 = pcVar10;
      pcVar4 = local_468;
      pcVar5 = pcVar7;
      if ((cVar1 == '(') ||
         (pcVar8 = pcVar12, pcVar11 = pcVar7, pcVar4 = pcVar7, pcVar5 = local_458, cVar1 == '+')) {
LAB_00149660:
        local_458 = pcVar5;
        local_468 = pcVar4;
        pcVar7 = pcVar7 + 1;
        pcVar12 = pcVar8;
        pcVar10 = pcVar11;
        goto LAB_00149627;
      }
      if (cVar1 != '\0') {
        pcVar11 = pcVar10;
        pcVar4 = local_468;
        if (cVar1 == ')' && pcVar10 != (char *)0x0) goto LAB_00149667;
        goto LAB_00149660;
      }
      pcVar7 = (char *)0x0;
LAB_00149667:
      if (pcVar12 < pcVar10 &&
          (pcVar7 != (char *)0x0 && (pcVar10 != (char *)0x0 && pcVar12 != (char *)0x0))) {
        local_458 = pcVar12 + 1;
        *pcVar12 = '\0';
        *local_468 = '\0';
        *pcVar7 = '\0';
        local_468 = local_468 + 1;
        pcVar7 = (char *)__cxa_demangle(local_458,local_450,local_440,&local_444);
        if (local_444 == 0) {
          sVar9 = 0xc;
          pcVar12 = "  {} : {}+{}";
          args_1 = &local_450;
          local_450 = pcVar7;
        }
        else {
          sVar9 = 0xe;
          pcVar12 = "  {} : {}()+{}";
          args_1 = &local_458;
        }
        local_478 = 0;
        uStack_480 = 0;
        local_488 = 0;
        loc_01.funcname = (char *)0x0;
        loc_01.filename = (char *)0x0;
        loc_01.line = 0;
        loc_01._12_4_ = 0;
        fmt_01.size_ = sVar9;
        fmt_01.data_ = pcVar12;
        spdlog::logger::log_<char*&,char*&,char*&>
                  (logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   loc_01,critical,fmt_01,args,args_1,&local_468);
      }
      else {
        local_488 = 0;
        uStack_480 = 0;
        local_478 = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        fmt_00.size_ = 4;
        fmt_00.data_ = "  {}";
        spdlog::logger::log_<char*&>
                  (logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   loc_00,critical,fmt_00,args);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  free(local_450);
  free(__ptr);
  signal(local_45c,(__sighandler_t)0x0);
  if (abort_on_segfault_ != false) {
    MPI_Abort(&ompi_mpi_comm_world,1);
  }
  return;
}

Assistant:

void catch_sig(int signum)
{
    logger->critical("caught signal {}; active puppet {}; local group = {}, local rank = {}",
                     signum, active_puppet, proc_map->group(), proc_map->local_rank());

    // print backtrace
    void*   callstack[128];
    int     frames      = backtrace(callstack, 128);
    char**  strs        = backtrace_symbols(callstack, frames);

    size_t funcnamesize = 256;
    char*  funcname     = (char*) malloc(funcnamesize);

    // iterate over the returned symbol lines. skip the first, it is the
    // address of this function.
    for (int i = 1; i < frames; i++)
    {
        char *begin_name = 0, *begin_offset = 0, *end_offset = 0;

        // find parentheses and +address offset surrounding the mangled name:
        // ./module(function+0x15c) [0x8048a6d]
        for (char *p = strs[i]; *p; ++p)
        {
            if (*p == '(')
                begin_name = p;
            else if (*p == '+')
                begin_offset = p;
            else if (*p == ')' && begin_offset)
            {
                end_offset = p;
                break;
            }
        }

        if (begin_name && begin_offset && end_offset && begin_name < begin_offset)
        {
            *begin_name++   = '\0';
            *begin_offset++ = '\0';
            *end_offset     = '\0';

            // mangled name is now in [begin_name, begin_offset) and caller
            // offset in [begin_offset, end_offset). now apply __cxa_demangle():

            int status;
            char* ret = abi::__cxa_demangle(begin_name, funcname, &funcnamesize, &status);
            if (status == 0)
            {
                funcname = ret; // use possibly realloc()-ed string
                logger->critical("  {} : {}+{}", strs[i], funcname, begin_offset);
            } else
            {
                // demangling failed. Output function name as a C function with no arguments.
                logger->critical("  {} : {}()+{}", strs[i], begin_name, begin_offset);
            }
        }
        else
        {
            // couldn't parse the line? print the whole line.
            logger->critical("  {}", strs[i]);
        }
    }

    free(funcname);
    free(strs);

    //for (int i = 0; i < frames; ++i)
    //    logger->critical("{}", strs[i]);

    signal(signum, SIG_DFL);    // restore the default signal
    if (abort_on_segfault_)
        MPI_Abort(MPI_COMM_WORLD, 1);
}